

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::base::PeriodicTask::~PeriodicTask(PeriodicTask *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var1;
  function<void_()> *pfVar2;
  
  Reset(this);
  *(this->weak_ptr_factory_).weak_ptr_.handle_.
   super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type)0x0;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&this->timer_fd_,-1);
  p_Var1 = (this->args_).task.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    pfVar2 = &(this->args_).task;
    (*p_Var1)((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
  }
  return;
}

Assistant:

PeriodicTask::~PeriodicTask() {
  Reset();
}